

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O0

void Pla_ManConvertFromBits(Pla_Man_t *p)

{
  int iVar1;
  int iVar2;
  word *p_00;
  Vec_Int_t *p_01;
  int local_30;
  int Count;
  int Lit;
  int k;
  int i;
  word *pCube;
  Vec_Int_t *vCube;
  Pla_Man_t *p_local;
  
  Vec_WecClear(&p->vCubeLits);
  Vec_WecClear(&p->vOccurs);
  iVar1 = Pla_ManCubeNum(p);
  Vec_WecInit(&p->vCubeLits,iVar1);
  iVar1 = Pla_ManInNum(p);
  Vec_WecInit(&p->vOccurs,iVar1 << 1);
  Lit = 0;
  while( true ) {
    iVar1 = Pla_ManCubeNum(p);
    if (iVar1 <= Lit) {
      return;
    }
    p_00 = Pla_CubeIn(p,Lit);
    p_01 = Vec_WecEntry(&p->vCubeLits,Lit);
    local_30 = 0;
    for (Count = 0; iVar1 = Pla_ManInNum(p), Count < iVar1; Count = Count + 1) {
      iVar1 = Pla_CubeGetLit(p_00,Count);
      if (iVar1 != 0) {
        local_30 = local_30 + 1;
      }
    }
    Vec_IntGrow(p_01,local_30);
    for (Count = 0; iVar1 = Pla_ManInNum(p), Count < iVar1; Count = Count + 1) {
      iVar1 = Pla_CubeGetLit(p_00,Count);
      if (iVar1 != 0) {
        iVar1 = Abc_Var2Lit(Count,(uint)(iVar1 == 1));
        Vec_WecPush(&p->vCubeLits,Lit,iVar1);
        Vec_WecPush(&p->vOccurs,iVar1,Lit);
      }
    }
    iVar1 = Vec_IntSize(p_01);
    iVar2 = Vec_IntCap(p_01);
    if (iVar1 != iVar2) break;
    Lit = Lit + 1;
  }
  __assert_fail("Vec_IntSize(vCube) == Vec_IntCap(vCube)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/pla/plaMan.c"
                ,0xf8,"void Pla_ManConvertFromBits(Pla_Man_t *)");
}

Assistant:

void Pla_ManConvertFromBits( Pla_Man_t * p )
{
    Vec_Int_t * vCube;
    word * pCube; int i, k, Lit, Count;
    Vec_WecClear( &p->vCubeLits );
    Vec_WecClear( &p->vOccurs );
    Vec_WecInit( &p->vCubeLits, Pla_ManCubeNum(p) );
    Vec_WecInit( &p->vOccurs, 2*Pla_ManInNum(p) );
    Pla_ForEachCubeIn( p, pCube, i )
    {
        vCube = Vec_WecEntry( &p->vCubeLits, i );

        Count = 0;
        Pla_CubeForEachLitIn( p, pCube, Lit, k )
            if ( Lit != PLA_LIT_DASH )
                Count++;
        Vec_IntGrow( vCube, Count );

        Count = 0;
        Pla_CubeForEachLitIn( p, pCube, Lit, k )
            if ( Lit != PLA_LIT_DASH )
            {
                Lit = Abc_Var2Lit( k, Lit == PLA_LIT_ZERO );
                Vec_WecPush( &p->vCubeLits, i, Lit );
//                Vec_WecPush( &p->vOccurs, Lit, Pla_CubeHandle(i, Count++) );
                Vec_WecPush( &p->vOccurs, Lit, i );
            }
        assert( Vec_IntSize(vCube) == Vec_IntCap(vCube) );
    }
}